

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void qt_alphamapblit_nonpremul_argb32
               (QRasterBuffer *rasterBuffer,int x,int y,QRgba64 *color,uchar *map,int mapWidth,
               int mapHeight,int mapStride,QClipData *clip,bool useGammaCorrection)

{
  int iVar1;
  long lVar2;
  DestFetchProc64 p_Var3;
  DestStoreProc64 p_Var4;
  QRgba64 srcColor_00;
  bool bVar5;
  int *piVar6;
  uchar *puVar7;
  QRasterBuffer *in_RCX;
  int in_EDX;
  int in_ESI;
  QRasterBuffer *in_RDI;
  QRgba64 *in_R8;
  int in_R9D;
  long in_FS_OFFSET;
  int in_stack_00000008;
  long in_stack_00000018;
  undefined1 uStack0000000000000020;
  QRgba64 *dest64;
  QClipData *in_stack_00000030;
  int j;
  quint32 *dest;
  int l;
  int i;
  bool dstFullyOpaque;
  int ly;
  DestStoreProc64 destStore64;
  DestFetchProc64 destFetch64;
  quint32 c;
  QColorTrcLut *colorProfile;
  int length;
  QRgba64 srcColor;
  QRgba64 buffer [2048];
  undefined4 in_stack_ffffffffffffbf28;
  undefined4 in_stack_ffffffffffffbf2c;
  undefined4 in_stack_ffffffffffffbf30;
  quint32 in_stack_ffffffffffffbf34;
  QRgba64 *in_stack_ffffffffffffbf38;
  undefined4 in_stack_ffffffffffffbf40;
  int in_stack_ffffffffffffbf44;
  undefined4 in_stack_ffffffffffffbf48;
  uint in_stack_ffffffffffffbf4c;
  uint uVar8;
  QRgba64 in_stack_ffffffffffffbf50;
  undefined4 in_stack_ffffffffffffbf58;
  int iVar9;
  int local_4094;
  bool local_408d;
  int local_408c;
  undefined8 in_stack_ffffffffffffbf90;
  QColorTrcLut *pQVar10;
  undefined3 in_stack_ffffffffffffbf98;
  int local_402c;
  quint64 local_4028;
  quint64 local_4020;
  quint64 local_4018;
  QRgba64 local_4010 [3];
  int in_stack_ffffffffffffc008;
  int in_stack_ffffffffffffc00c;
  QRgba64 in_stack_ffffffffffffc058;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar8 = CONCAT13(uStack0000000000000020,in_stack_ffffffffffffbf98) & 0x1ffffff;
  if (in_stack_00000018 == 0) {
    bVar5 = QRgba64::isTransparent((QRgba64 *)in_RCX);
    if (!bVar5) {
      pQVar10 = (QColorTrcLut *)0x0;
      if ((uVar8 & 0x1000000) != 0) {
        QGuiApplicationPrivate::instance();
        pQVar10 = QGuiApplicationPrivate::colorProfileForA8Text((QGuiApplicationPrivate *)0xb45edd);
      }
      QRgba64::toArgb32((QRgba64 *)in_RCX);
      local_4018._0_1_ = in_RCX->monoDestinationWithClut;
      local_4018._1_3_ = *(undefined3 *)&in_RCX->field_0x1;
      local_4018._4_4_ = in_RCX->destColor0;
      if ((pQVar10 != (QColorTrcLut *)0x0) && (bVar5 = QRgba64::isOpaque((QRgba64 *)in_RCX), bVar5))
      {
        local_4028 = local_4018;
        local_4020 = (quint64)QColorTrcLut::toLinear
                                        ((QColorTrcLut *)
                                         CONCAT44(in_stack_ffffffffffffbf34,
                                                  in_stack_ffffffffffffbf30),
                                         in_stack_ffffffffffffc058);
        local_4018 = local_4020;
      }
      p_Var3 = destFetchProc64[in_RDI->format];
      p_Var4 = destStoreProc64[in_RDI->format];
      for (local_408c = 0; local_408c < in_stack_00000008; local_408c = local_408c + 1) {
        local_408d = true;
        local_4094 = in_ESI;
        for (local_402c = in_R9D; 0 < local_402c; local_402c = local_402c - iVar1) {
          piVar6 = qMin<int>(&BufferSize,&local_402c);
          iVar1 = *piVar6;
          puVar7 = QRasterBuffer::scanLine(in_RDI,in_EDX + local_408c);
          iVar9 = 0;
          uVar8 = in_stack_ffffffffffffbf4c;
          while( true ) {
            in_stack_ffffffffffffbf4c = uVar8 & 0xffffff;
            if (iVar9 < iVar1) {
              in_stack_ffffffffffffbf4c = CONCAT13(local_408d,(int3)uVar8);
            }
            if ((in_stack_ffffffffffffbf4c & 0x1000000) == 0) break;
            local_408d = (*(uint *)(puVar7 + (long)iVar9 * 4 + (long)local_4094 * 4) & 0xff000000)
                         == 0xff000000;
            iVar9 = iVar9 + 1;
            uVar8 = in_stack_ffffffffffffbf4c;
          }
          if (local_408d == false) {
            in_stack_ffffffffffffbf50.rgba =
                 (quint64)(*p_Var3)(local_4010,in_RDI,local_4094,in_EDX + local_408c,iVar1);
            srcColor_00.rgba._4_4_ = iVar9;
            srcColor_00.rgba._0_4_ = in_stack_ffffffffffffbf58;
            qt_alphamapblit_generic_oneline
                      ((uchar *)CONCAT44(in_stack_ffffffffffffbf4c,in_stack_ffffffffffffbf48),
                       in_stack_ffffffffffffbf44,srcColor_00,in_stack_ffffffffffffbf38,
                       in_stack_ffffffffffffbf50,
                       (QColorTrcLut *)CONCAT44(in_stack_ffffffffffffbf34,in_stack_ffffffffffffbf30)
                      );
            if (p_Var4 != (DestStoreProc64)0x0) {
              (*p_Var4)(in_RDI,local_4094,in_EDX + local_408c,
                        (QRgba64 *)in_stack_ffffffffffffbf50.rgba,iVar1);
            }
          }
          else {
            qt_alphamapblit_argb32_oneline
                      ((uchar *)in_stack_ffffffffffffbf50.rgba,in_stack_ffffffffffffbf4c,
                       (QRgba64 *)CONCAT44(in_stack_ffffffffffffbf44,in_stack_ffffffffffffbf40),
                       (quint32 *)in_stack_ffffffffffffbf38,in_stack_ffffffffffffbf34,
                       (QColorTrcLut *)CONCAT44(in_stack_ffffffffffffbf2c,in_stack_ffffffffffffbf28)
                      );
          }
          local_4094 = iVar1 + local_4094;
        }
      }
    }
  }
  else {
    qt_alphamapblit_generic
              (in_RCX,in_stack_ffffffffffffc00c,in_stack_ffffffffffffc008,in_R8,
               (uchar *)(CONCAT44(in_R9D,CONCAT13(uStack0000000000000020,in_stack_ffffffffffffbf98))
                        & 0xffffffff01ffffff),(int)((ulong)in_stack_ffffffffffffbf90 >> 0x20),
               _uStack0000000000000020,(int)dest64,in_stack_00000030,
               SUB81((ulong)in_stack_ffffffffffffbf90 >> 0x18,0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void qt_alphamapblit_nonpremul_argb32(QRasterBuffer *rasterBuffer,
                                             int x, int y, const QRgba64 &color,
                                             const uchar *map,
                                             int mapWidth, int mapHeight, int mapStride,
                                             const QClipData *clip, bool useGammaCorrection)
{
    if (clip)
        return qt_alphamapblit_generic(rasterBuffer, x, y, color, map, mapWidth, mapHeight,
                                       mapStride, clip, useGammaCorrection);

    if (color.isTransparent())
        return;

    const QColorTrcLut *colorProfile = nullptr;

    if (useGammaCorrection)
        colorProfile = QGuiApplicationPrivate::instance()->colorProfileForA8Text();

    const quint32 c = color.toArgb32();
    QRgba64 srcColor = color;
    if (colorProfile && color.isOpaque())
        srcColor = colorProfile->toLinear(srcColor);

    alignas(8) Q_DECL_UNINITIALIZED QRgba64 buffer[BufferSize];
    const DestFetchProc64 destFetch64 = destFetchProc64[rasterBuffer->format];
    const DestStoreProc64 destStore64 = destStoreProc64[rasterBuffer->format];

    for (int ly = 0; ly < mapHeight; ++ly) {
        bool dstFullyOpaque = true;
        int i = x;
        int length = mapWidth;
        while (length > 0) {
            int l = qMin(BufferSize, length);
            quint32 *dest = reinterpret_cast<quint32*>(rasterBuffer->scanLine(y + ly)) + i;
            for (int j = 0; j < l && dstFullyOpaque; ++j)
                dstFullyOpaque = (dest[j] & 0xff000000) == 0xff000000;
            if (dstFullyOpaque) {
                // Use RGB/ARGB32PM optimized version
                qt_alphamapblit_argb32_oneline(map + i - x, l, srcColor, dest, c, colorProfile);
            } else {
                // Use generic version
                QRgba64 *dest64 = destFetch64(buffer, rasterBuffer, i, y + ly, l);
                qt_alphamapblit_generic_oneline(map + i - x, l,
                                                srcColor, dest64, color,
                                                colorProfile);
                if (destStore64)
                    destStore64(rasterBuffer, i, y + ly, dest64, l);
            }
            length -= l;
            i += l;
        }
        map += mapStride;
    }
}